

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O1

void __thiscall SharedDirectory::index_files(SharedDirectory *this)

{
  reference pdVar1;
  error_code *peVar2;
  unsigned_long uVar3;
  uint64_t uVar4;
  ulong uVar5;
  directory_iterator itr;
  directory_iterator end;
  uint64_t size;
  path file;
  directory_iterator local_90;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_88;
  SharedDirectory *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  unsigned_long local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_88.px = (dir_itr_imp *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *)this);
  local_80 = this;
  boost::filesystem::directory_iterator::directory_iterator(&local_90,&this->shared_dir,none);
  uVar5 = 0;
  while( true ) {
    if ((local_90.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_88.px) ||
       (((local_90.m_imp.px == (dir_itr_imp *)0x0 ||
         (*(long *)((long)local_90.m_imp.px + 0x38) == 0)) &&
        ((local_88.px == (dir_itr_imp *)0x0 || (*(long *)(local_88.px + 0x38) == 0)))))) break;
    pdVar1 = boost::filesystem::directory_iterator::dereference(&local_90);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,*(long *)pdVar1,*(long *)(pdVar1 + 8) + *(long *)pdVar1);
    peVar2 = (error_code *)boost::filesystem::directory_iterator::dereference(&local_90);
    boost::filesystem::detail::status((path *)&local_78,peVar2);
    if ((int)local_78._M_dataplus._M_p == 2) {
      uVar3 = boost::filesystem::detail::file_size((path *)local_50,(error_code *)0x0);
      local_58 = uVar3;
      boost::filesystem::path::filename();
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,unsigned_long&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)local_80,&local_78,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + uVar3;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    boost::filesystem::detail::directory_iterator_increment(&local_90,(error_code *)0x0);
  }
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_90.m_imp);
  uVar4 = 0;
  if (uVar5 <= local_80->total_space) {
    uVar4 = local_80->total_space - uVar5;
  }
  local_80->remaining_space = uVar4;
  boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_88);
  return;
}

Assistant:

void SharedDirectory::index_files() {
  directory_iterator end;
  uint64_t actual_space = 0;
  indexed_files.clear();
  for (directory_iterator itr{shared_dir}; itr != end; ++itr) {
    auto file = itr->path();
    if (!is_regular_file(itr->path())) {
      continue;
    }
    uint64_t size = file_size(file);
    actual_space += size;
    indexed_files.emplace(file.filename().string(), size);
  }
  remaining_space = total_space < actual_space ? 0 : total_space - actual_space;
}